

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O0

Image * __thiscall ImageTypeManager::image(ImageTypeManager *this,uint8_t type)

{
  bool bVar1;
  const_iterator this_00;
  const_iterator message;
  undefined8 uVar2;
  Image *in_RDI;
  const_iterator image;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffa8;
  Image *this_01;
  
  this_01 = in_RDI;
  this_00 = std::
            map<unsigned_char,_PenguinV_Image::ImageTemplate<unsigned_char>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_PenguinV_Image::ImageTemplate<unsigned_char>_>_>_>
            ::find((map<unsigned_char,_PenguinV_Image::ImageTemplate<unsigned_char>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_PenguinV_Image::ImageTemplate<unsigned_char>_>_>_>
                    *)in_stack_ffffffffffffffa8,(key_type *)0x110979);
  message = std::
            map<unsigned_char,_PenguinV_Image::ImageTemplate<unsigned_char>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_PenguinV_Image::ImageTemplate<unsigned_char>_>_>_>
            ::cend((map<unsigned_char,_PenguinV_Image::ImageTemplate<unsigned_char>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_PenguinV_Image::ImageTemplate<unsigned_char>_>_>_>
                    *)in_stack_ffffffffffffffa8);
  bVar1 = std::operator==((_Self *)&stack0xffffffffffffffe0,(_Self *)&stack0xffffffffffffffd8);
  if (!bVar1) {
    std::
    _Rb_tree_const_iterator<std::pair<const_unsigned_char,_PenguinV_Image::ImageTemplate<unsigned_char>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_char,_PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                  *)0x110a02);
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(this_01,in_stack_ffffffffffffffa8);
    return in_RDI;
  }
  uVar2 = __cxa_allocate_exception(0x28);
  imageException::imageException((imageException *)this_00._M_node,(char *)message._M_node);
  __cxa_throw(uVar2,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

PenguinV_Image::Image ImageTypeManager::image( uint8_t type ) const
{
    std::map< uint8_t, PenguinV_Image::Image >::const_iterator image = _image.find( type );
    if ( image == _image.cend() )
        throw imageException( "Image is not registered" );

    return image->second;
}